

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O3

void __thiscall Imf_3_2::SimdAlignedBuffer64<float>::alloc(SimdAlignedBuffer64<float> *this)

{
  int iVar1;
  float *pfVar2;
  void *ptr;
  float *local_20;
  
  local_20 = (float *)0x0;
  iVar1 = posix_memalign(&local_20,0x20,0x100);
  pfVar2 = (float *)0x0;
  if (iVar1 == 0) {
    pfVar2 = local_20;
  }
  this->_handle = (char *)pfVar2;
  if (((ulong)pfVar2 & 0x1f) != 0) {
    free(pfVar2);
    local_20 = (float *)0x0;
    iVar1 = posix_memalign(&local_20,0x20,0x120);
    pfVar2 = (float *)0x0;
    if (iVar1 == 0) {
      pfVar2 = local_20;
    }
    this->_handle = (char *)pfVar2;
    pfVar2 = (float *)((long)pfVar2 + (ulong)(-(int)pfVar2 & 0x1f));
  }
  this->_buffer = pfVar2;
  return;
}

Assistant:

void alloc ()
    {
        //
        // Try EXRAllocAligned first - but it might fallback to
        // unaligned allocs. If so, overalloc.
        //

        _handle = (char*) EXRAllocAligned (64 * sizeof (T), _SSE_ALIGNMENT);

        if (((size_t) _handle & (_SSE_ALIGNMENT - 1)) == 0)
        {
            _buffer = (T*) _handle;
            return;
        }

        EXRFreeAligned (_handle);
        _handle = (char*) EXRAllocAligned (
            64 * sizeof (T) + _SSE_ALIGNMENT, _SSE_ALIGNMENT);

        char* aligned = _handle;

        while ((size_t) aligned & (_SSE_ALIGNMENT - 1))
            aligned++;

        _buffer = (T*) aligned;
    }